

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O3

void __thiscall CMud::LoadGreetingScreen(CMud *this)

{
  char cVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  char tempbuf [210];
  char buf [4096];
  char acStack_1108 [222];
  char acStack_102a [4106];
  
  __stream = fopen("../configs/login_banner.txt","r");
  acStack_102a[2] = 0;
  pcVar2 = fgets(acStack_1108,200,__stream);
  if (pcVar2 != (char *)0x0) {
    do {
      strcat(acStack_102a + 2,acStack_1108);
      sVar3 = strlen(acStack_102a + 2);
      (acStack_102a + sVar3 + 2)[0] = '\r';
      (acStack_102a + sVar3 + 2)[1] = '\0';
      pcVar2 = fgets(acStack_1108,200,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  lVar4 = -0x300000000;
  pcVar2 = acStack_102a + 2;
  do {
    lVar4 = lVar4 + 0x100000000;
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != '\0');
  acStack_102a[(lVar4 >> 0x20) + 2] = '\0';
  fclose(__stream);
  RString::operator=(&this->greeting_screen,acStack_102a + 2);
  help_greeting = palloc_string(acStack_102a + 2);
  return;
}

Assistant:

void CMud::LoadGreetingScreen()
{
	//can't use cfile because of weird \r action
	FILE *fp = fopen(LOGIN_BANNER_FILE, "r");
	char tempbuf[210], buf[4096];
	int i;
	buf[0] = '\0';
	while(fgets(tempbuf,200,fp))
 	{	
		strcat(buf,tempbuf);
       	strcat(buf,"\r");
    }
	for(i=0; buf[i] != '\0'; i++)
		;
	buf[i-2] = '\0';
   	fclose(fp);
	greeting_screen = buf;
	help_greeting = palloc_string(buf);
}